

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall hwnet::util::Timer::operator()(Timer *this)

{
  enable_shared_from_this<hwnet::util::Timer> local_20;
  Timer *local_10;
  Timer *this_local;
  
  local_10 = this;
  std::enable_shared_from_this<hwnet::util::Timer>::shared_from_this(&local_20);
  std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator()
            (&this->mCallback,(shared_ptr<hwnet::util::Timer> *)&local_20);
  std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)&local_20);
  return;
}

Assistant:

void Timer::operator() ()
{	
    mCallback(shared_from_this());   
}